

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlNewChild(xmlNodePtr parent,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  _xmlNode *p_Var1;
  uint uVar2;
  xmlNodePtr pxVar3;
  
  if (name != (xmlChar *)0x0 && parent != (xmlNodePtr)0x0) {
    uVar2 = parent->type - XML_ELEMENT_NODE;
    uVar2 = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f;
    if (2 < uVar2 - 4) {
      if (uVar2 != 0) {
        return (xmlNodePtr)0x0;
      }
      if (ns == (xmlNsPtr)0x0) {
        ns = parent->ns;
      }
    }
    pxVar3 = xmlNewDocNode(parent->doc,ns,name,content);
    if (pxVar3 != (xmlNodePtr)0x0) {
      pxVar3->parent = parent;
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = pxVar3;
      }
      else {
        p_Var1 = parent->last;
        p_Var1->next = pxVar3;
        pxVar3->prev = p_Var1;
      }
      parent->last = pxVar3;
      return pxVar3;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNewChild(xmlNodePtr parent, xmlNsPtr ns,
            const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur, prev;

    if ((parent == NULL) || (name == NULL))
	return(NULL);

    switch (parent->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
            break;

        case XML_ELEMENT_NODE:
            if (ns == NULL)
                ns = parent->ns;
            break;

        default:
            return(NULL);
    }

    cur = xmlNewDocNode(parent->doc, ns, name, content);
    if (cur == NULL)
        return(NULL);

    /*
     * add the new element at the end of the children list.
     */
    cur->parent = parent;
    if (parent->children == NULL) {
        parent->children = cur;
	parent->last = cur;
    } else {
        prev = parent->last;
	prev->next = cur;
	cur->prev = prev;
	parent->last = cur;
    }

    return(cur);
}